

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

void __thiscall Js::SharedContents::AddAgent(SharedContents *this,DWORD_PTR agent)

{
  int iVar1;
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  HeapAllocator *alloc;
  SharableAgents *pSVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  CCLock::Enter(&(this->csAgent).super_CCLock);
  if (this->allowedAgents == (SharableAgents *)0x0) {
    local_50 = (undefined1  [8])
               &JsUtil::
                List<unsigned_long,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_8e316d4;
    data.filename._0_4_ = 0xf;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    pSVar2 = (SharableAgents *)new<Memory::HeapAllocator>(0x30,alloc,0x300d4a);
    (pSVar2->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (pSVar2->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
    (pSVar2->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).alloc =
         &Memory::HeapAllocator::Instance;
    (pSVar2->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_015454f0;
    pSVar2->length = 0;
    pSVar2->increment = 4;
    this->allowedAgents = pSVar2;
  }
  this_00 = this->allowedAgents;
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(this_00,0);
  iVar1 = (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count
  ;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar1]
       = agent;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
       iVar1 + 1;
  CCLock::Leave(&(this->csAgent).super_CCLock);
  return;
}

Assistant:

void SharedContents::AddAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        if (allowedAgents == nullptr)
        {
            allowedAgents = HeapNew(SharableAgents, &HeapAllocator::Instance);
        }

        allowedAgents->Add(agent);
    }